

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O3

bool __thiscall ConditionalExecution::testIBlock(ConditionalExecution *this)

{
  BlockBasic *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  PcodeOp *pPVar3;
  
  pBVar1 = this->iblock;
  if (((int)((ulong)((long)(pBVar1->super_FlowBlock).intothis.
                           super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pBVar1->super_FlowBlock).intothis.
                          super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) * -0x55555555 == 2) &&
     ((int)((ulong)((long)(pBVar1->super_FlowBlock).outofthis.
                          super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pBVar1->super_FlowBlock).outofthis.
                         super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) * -0x55555555 == 2)) {
    iVar2 = (*(pBVar1->super_FlowBlock)._vptr_FlowBlock[0xe])();
    pPVar3 = (PcodeOp *)CONCAT44(extraout_var,iVar2);
    this->cbranch = pPVar3;
    if (pPVar3 != (PcodeOp *)0x0) {
      return pPVar3->opcode->opcode == CPUI_CBRANCH;
    }
  }
  return false;
}

Assistant:

bool ConditionalExecution::testIBlock(void)

{
  if (iblock->sizeIn() != 2) return false;
  if (iblock->sizeOut() != 2) return false;
  cbranch = iblock->lastOp();
  if (cbranch == (PcodeOp *)0) return false;
  if (cbranch->code() != CPUI_CBRANCH) return false;
  return true;
}